

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O1

void __thiscall masc::polygon::c_polygon::destroy(c_polygon *this)

{
  c_polygon *pcVar1;
  pointer pppVar2;
  
  for (pcVar1 = (c_polygon *)
                (this->super_c_plylist).
                super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>.
                super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>.
                _M_impl._M_node.super__List_node_base._M_next; pcVar1 != this;
      pcVar1 = (c_polygon *)
               (pcVar1->super_c_plylist).
               super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>.
               super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>._M_impl
               ._M_node.super__List_node_base._M_next) {
    c_ply::destroy((c_ply *)&(pcVar1->super_c_plylist).
                             super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>
                             .
                             super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>
                             ._M_impl._M_node._M_size);
  }
  std::__cxx11::_List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>::_M_clear
            ((_List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_> *)this);
  (this->super_c_plylist).super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>.
  super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this;
  (this->super_c_plylist).super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>.
  super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this;
  (this->super_c_plylist).super_list<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>.
  super__List_base<masc::polygon::c_ply,_std::allocator<masc::polygon::c_ply>_>._M_impl._M_node.
  _M_size = 0;
  pppVar2 = (this->all).
            super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->all).
      super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != pppVar2) {
    (this->all).
    super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = pppVar2;
  }
  return;
}

Assistant:

void c_polygon::destroy()
{
    for(iterator i=begin();i!=end();i++){
        i->destroy();
    }
    clear(); //remove all ply from this list
    all.clear();
}